

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  undefined8 *puVar7;
  FuncDef *pFVar8;
  Parse *pParse_00;
  byte *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ExprList *pOBList;
  int nArg;
  u8 enc;
  AggInfo_func *pItem_1;
  SrcItem *pItem;
  int iDataCur;
  IndexedExpr *pIEpr;
  AggInfo *pAggInfo;
  SrcList *pSrcList;
  Parse *pParse;
  NameContext *pNC;
  int i;
  Expr tmp;
  Expr *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar9;
  Expr *in_stack_ffffffffffffff50;
  AggInfo *in_stack_ffffffffffffff58;
  AggInfo *pAggInfo_00;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  sqlite3 *in_stack_ffffffffffffff68;
  long lVar10;
  int local_6c;
  int local_54;
  undefined1 local_50 [44];
  undefined4 local_24;
  undefined2 local_20;
  short local_1e;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)(in_RDI + 0x28);
  lVar3 = *plVar2;
  piVar4 = (int *)plVar2[1];
  lVar5 = plVar2[2];
  pParse_00 = (Parse *)(ulong)(*in_RSI - 0xa8);
  switch(pParse_00) {
  case (Parse *)0x0:
  case (Parse *)0x2:
  case (Parse *)0xb:
    if (piVar4 != (int *)0x0) {
      pAggInfo_00 = (AggInfo *)(piVar4 + 2);
      for (local_6c = 0; local_6c < *piVar4; local_6c = local_6c + 1) {
        if (*(int *)(in_RSI + 0x2c) == *(int *)((long)&pAggInfo_00->aCol + 4)) {
          findOrCreateAggInfoColumn
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     pAggInfo_00,in_stack_ffffffffffffff50);
          break;
        }
        pAggInfo_00 = (AggInfo *)&pAggInfo_00[1].pGroupBy;
      }
    }
    local_54 = 0;
    break;
  case (Parse *)0x1:
    if ((((*(uint *)(plVar2 + 5) & 0x20000) == 0) && (*(uint *)(in_RDI + 0x20) == (uint)in_RSI[2]))
       && (*(long *)(in_RSI + 0x38) == 0)) {
      puVar7 = *(undefined8 **)(lVar5 + 0x28);
      local_6c = 0;
      while (((local_6c < *(int *)(lVar5 + 0x30) && ((byte *)*puVar7 != in_RSI)) &&
             (iVar6 = sqlite3ExprCompare(pParse_00,
                                         (Expr *)CONCAT44(in_stack_ffffffffffffff34,
                                                          in_stack_ffffffffffffff30),
                                         in_stack_ffffffffffffff28,0), iVar6 != 0))) {
        local_6c = local_6c + 1;
        puVar7 = puVar7 + 4;
      }
      if ((*(int *)(lVar5 + 0x30) <= local_6c) &&
         (local_6c = addAggInfoFunc((sqlite3 *)
                                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                    (AggInfo *)in_stack_ffffffffffffff28), -1 < local_6c)) {
        puVar7 = (undefined8 *)(*(long *)(lVar5 + 0x28) + (long)local_6c * 0x20);
        *puVar7 = in_RSI;
        if (*(long *)(in_RSI + 0x20) == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = **(int **)(in_RSI + 0x20);
        }
        iVar9 = iVar6;
        pFVar8 = sqlite3FindFunction(in_stack_ffffffffffffff68,
                                     (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                      in_stack_ffffffffffffff60),
                                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                     (u8)((ulong)in_stack_ffffffffffffff58 >> 0x18),
                                     (u8)((ulong)in_stack_ffffffffffffff58 >> 0x10));
        puVar7[1] = pFVar8;
        if ((*(long *)(in_RSI + 0x10) == 0) || ((*(uint *)(puVar7[1] + 4) & 0x20) != 0)) {
          *(undefined4 *)(puVar7 + 3) = 0xffffffff;
        }
        else {
          iVar1 = *(int *)(lVar3 + 0x38);
          *(int *)(lVar3 + 0x38) = iVar1 + 1;
          *(int *)(puVar7 + 3) = iVar1;
          if (((**(int **)(*(long *)(in_RSI + 0x10) + 0x20) == 1) && (iVar6 == 1)) &&
             (iVar6 = sqlite3ExprCompare(pParse_00,(Expr *)CONCAT44(iVar9,in_stack_ffffffffffffff30)
                                         ,in_stack_ffffffffffffff28,0), iVar6 == 0)) {
            *(undefined1 *)((long)puVar7 + 0x1c) = 0;
            *(bool *)((long)puVar7 + 0x1d) = (*(uint *)(in_RSI + 4) & 4) != 0;
          }
          else {
            *(undefined1 *)((long)puVar7 + 0x1c) = 1;
          }
          *(bool *)((long)puVar7 + 0x1e) = (*(uint *)(puVar7[1] + 4) & 0x100000) != 0;
        }
        if (((*(uint *)(in_RSI + 4) & 4) == 0) || (*(char *)((long)puVar7 + 0x1d) != '\0')) {
          *(undefined4 *)(puVar7 + 2) = 0xffffffff;
        }
        else {
          iVar6 = *(int *)(lVar3 + 0x38);
          *(int *)(lVar3 + 0x38) = iVar6 + 1;
          *(int *)(puVar7 + 2) = iVar6;
        }
      }
      *(short *)(in_RSI + 0x32) = (short)local_6c;
      *(long *)(in_RSI + 0x38) = lVar5;
      local_54 = 1;
    }
    else {
      local_54 = 0;
    }
    break;
  default:
    memset(local_50,0xaa,0x48);
    if (((*(uint *)(plVar2 + 5) & 0x20000) != 0) && (*(long *)(lVar3 + 0x60) != 0)) {
      lVar10 = *(long *)(lVar3 + 0x60);
      while ((lVar10 != 0 &&
             ((in_stack_ffffffffffffff64 = *(int *)(lVar10 + 8), in_stack_ffffffffffffff64 < 0 ||
              (iVar6 = sqlite3ExprCompare(pParse_00,
                                          (Expr *)CONCAT44(in_stack_ffffffffffffff34,
                                                           in_stack_ffffffffffffff30),
                                          in_stack_ffffffffffffff28,0), iVar6 != 0))))) {
        lVar10 = *(long *)(lVar10 + 0x18);
      }
      if ((lVar10 != 0) && ((*(uint *)(in_RSI + 4) & 0x3000000) == 0)) {
        local_6c = 0;
        while ((local_6c < *piVar4 && (piVar4[9] != *(int *)(lVar10 + 8)))) {
          local_6c = local_6c + 1;
        }
        if ((local_6c < *piVar4) && (*(long *)(in_RSI + 0x38) == 0)) {
          if (*(int *)(lVar3 + 0x34) == 0) {
            memset(local_50,0,0x48);
            local_50[0] = 0xaa;
            local_24 = *(undefined4 *)(lVar10 + 0xc);
            local_20 = (undefined2)*(undefined4 *)(lVar10 + 0x10);
            findOrCreateAggInfoColumn
                      ((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
            if (*(int *)(lVar3 + 0x34) == 0) {
              *(byte **)(*(long *)(lVar5 + 0x18) + (long)local_1e * 0x18 + 8) = in_RSI;
              *(long *)(in_RSI + 0x38) = lVar5;
              *(short *)(in_RSI + 0x32) = local_1e;
              local_54 = 1;
            }
            else {
              local_54 = 2;
            }
          }
          else {
            local_54 = 2;
          }
          break;
        }
      }
    }
    local_54 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_54;
  }
  __stack_chk_fail();
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  assert( pAggInfo->iFirstReg==0 );
  switch( pExpr->op ){
    default: {
      IndexedExpr *pIEpr;
      Expr tmp;
      assert( pParse->iSelfTab==0 );
      if( (pNC->ncFlags & NC_InAggFunc)==0 ) break;
      if( pParse->pIdxEpr==0 ) break;
      for(pIEpr=pParse->pIdxEpr; pIEpr; pIEpr=pIEpr->pIENext){
        int iDataCur = pIEpr->iDataCur;
        if( iDataCur<0 ) continue;
        if( sqlite3ExprCompare(0, pExpr, pIEpr->pExpr, iDataCur)==0 ) break;
      }
      if( pIEpr==0 ) break;
      if( NEVER(!ExprUseYTab(pExpr)) ) break;
      for(i=0; i<pSrcList->nSrc; i++){
         if( pSrcList->a[0].iCursor==pIEpr->iDataCur ) break;
      }
      if( i>=pSrcList->nSrc ) break;
      if( NEVER(pExpr->pAggInfo!=0) ) break; /* Resolved by outer context */
      if( pParse->nErr ){ return WRC_Abort; }

      /* If we reach this point, it means that expression pExpr can be
      ** translated into a reference to an index column as described by
      ** pIEpr.
      */
      memset(&tmp, 0, sizeof(tmp));
      tmp.op = TK_AGG_COLUMN;
      tmp.iTable = pIEpr->iIdxCur;
      tmp.iColumn = pIEpr->iIdxCol;
      findOrCreateAggInfoColumn(pParse, pAggInfo, &tmp);
      if( pParse->nErr ){ return WRC_Abort; }
      assert( pAggInfo->aCol!=0 );
      assert( tmp.iAgg<pAggInfo->nColumn );
      pAggInfo->aCol[tmp.iAgg].pCExpr = pExpr;
      pExpr->pAggInfo = pAggInfo;
      pExpr->iAgg = tmp.iAgg;
      return WRC_Prune;
    }
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            findOrCreateAggInfoColumn(pParse, pAggInfo, pExpr);
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Continue;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
       && pExpr->pAggInfo==0
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( NEVER(pItem->pFExpr==pExpr) ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            int nArg;
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            assert( ExprUseUToken(pExpr) );
            nArg = pExpr->x.pList ? pExpr->x.pList->nExpr : 0;
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                                         pExpr->u.zToken, nArg, enc, 0);
            assert( pItem->bOBUnique==0 );
            if( pExpr->pLeft
             && (pItem->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)==0
            ){
              /* The NEEDCOLL test above causes any ORDER BY clause on
              ** aggregate min() or max() to be ignored. */
              ExprList *pOBList;
              assert( nArg>0 );
              assert( pExpr->pLeft->op==TK_ORDER );
              assert( ExprUseXList(pExpr->pLeft) );
              pItem->iOBTab = pParse->nTab++;
              pOBList = pExpr->pLeft->x.pList;
              assert( pOBList->nExpr>0 );
              assert( pItem->bOBUnique==0 );
              if( pOBList->nExpr==1
               && nArg==1
               && sqlite3ExprCompare(0,pOBList->a[0].pExpr,
                               pExpr->x.pList->a[0].pExpr,0)==0
              ){
                pItem->bOBPayload = 0;
                pItem->bOBUnique = ExprHasProperty(pExpr, EP_Distinct);
              }else{
                pItem->bOBPayload = 1;
              }
              pItem->bUseSubtype =
                    (pItem->pFunc->funcFlags & SQLITE_SUBTYPE)!=0;
            }else{
              pItem->iOBTab = -1;
            }
            if( ExprHasProperty(pExpr, EP_Distinct) && !pItem->bOBUnique ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}